

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::unexpect(parser *this,token_type t)

{
  token_type t_00;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string_t local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string error_msg;
  
  if (this->last_token != t) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&error_msg,"parse error - unexpected ",(allocator *)&local_90);
  t_00 = this->last_token;
  if (t_00 == parse_error) {
    lexer::get_token_string(&local_70,&this->m_lexer);
    std::operator+(&local_50,"\'",&local_70);
    std::operator+(&local_90,&local_50,"\'");
  }
  else {
    lexer::token_type_name(&local_90,t_00);
  }
  std::__cxx11::string::append((string *)&error_msg);
  std::__cxx11::string::~string((string *)&local_90);
  if (t_00 == parse_error) {
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,(string *)&error_msg);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void unexpect(typename lexer::token_type t) const
        {
            if (t == last_token)
            {
                std::string error_msg = "parse error - unexpected ";
                error_msg += (last_token == lexer::token_type::parse_error ? ("'" +  m_lexer.get_token_string() +
                              "'") :
                              lexer::token_type_name(last_token));
                JSON_THROW(std::invalid_argument(error_msg));
            }
        }